

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_60(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  QPDF *pQVar2;
  int iVar3;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle QVar6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  QPDFWriter w;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  conflicts;
  QPDFObjectHandle r2;
  anon_class_8_1_ba1d6c52 make_resource;
  QPDFObjectHandle r1;
  anon_class_8_1_e5d0d581 show_conflicts;
  QPDFObjectHandle r3;
  int min_suffix;
  QPDFObjectHandle trailer;
  string local_168;
  undefined1 local_140 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Base_ptr local_120;
  size_t local_118;
  undefined8 local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  anon_class_8_1_ba1d6c52 local_100;
  QPDFObjectHandle local_f8;
  element_type local_e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  QPDFObjectHandle local_d8;
  long local_c8 [2];
  anon_class_8_1_e5d0d581 local_b8;
  string local_b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  undefined4 local_9c;
  string local_98 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  undefined8 local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  QPDF *local_48;
  undefined1 local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_48 = pdf;
  QPDFObjectHandle::newDictionary();
  local_9c = 1;
  iVar3 = 2;
  do {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"/Quack","");
    QPDFObjectHandle::getUniqueResourceName((string *)local_140,(int *)local_e8,(set *)&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"<< /Z << >> >>","");
    local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
    QPDFObjectHandle::parse((string *)local_40,(string *)&local_168);
    QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
    QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_e8;
    QPDFObjectHandle::mergeResources(QVar4,(map *)0x0);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_c8) {
      operator_delete(local_d8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_c8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"/Z","");
    QPDFObjectHandle::getKey((string *)&local_f8);
    local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"moo","");
    QPDFObjectHandle::newString((string *)&local_110);
    QPDFObjectHandle::replaceKey((string *)&local_f8,(QPDFObjectHandle *)local_140);
    if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
    }
    if (local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_c8) {
      operator_delete(local_d8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_c8[0] + 1);
    }
    if (local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
      operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
    }
    pQVar2 = local_48;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  local_100.pdf = local_48;
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/Z","");
  QPDFObjectHandle::getKey((string *)&local_d8);
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/Y","");
  QPDFObjectHandle::newDictionary();
  QPDFObjectHandle::replaceKey((string *)local_e8,(QPDFObjectHandle *)local_140);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length);
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/Y","");
  QPDFObjectHandle::getKey((string *)&local_f8);
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/F1","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"r1.Z.F1","");
  test_60::anon_class_8_1_ba1d6c52::operator()(&local_100,&local_d8,(string *)local_140,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/F2","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"r1.Z.F2","");
  test_60::anon_class_8_1_ba1d6c52::operator()(&local_100,&local_d8,(string *)local_140,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/F2","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"r1.Y.F2","");
  test_60::anon_class_8_1_ba1d6c52::operator()(&local_100,&local_f8,(string *)local_140,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/F3","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"r1.Y.F3","");
  test_60::anon_class_8_1_ba1d6c52::operator()(&local_100,&local_f8,(string *)local_140,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"<< /Z << >> /Y << >> >>","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
  QPDFObjectHandle::parse((string *)&local_110,(string *)local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/Z","");
  QPDFObjectHandle::getKey((string *)&local_168);
  _Var1._M_pi = local_d8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length;
  local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168._M_dataplus._M_p;
  local_168._M_dataplus._M_p = (pointer)0x0;
  local_168._M_string_length = 0;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length);
    }
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/Y","");
  QPDFObjectHandle::getKey((string *)&local_168);
  _Var1._M_pi = local_f8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length;
  local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168._M_dataplus._M_p;
  local_168._M_dataplus._M_p = (pointer)0x0;
  local_168._M_string_length = 0;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length);
    }
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/F2","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"r2.Z.F2","");
  test_60::anon_class_8_1_ba1d6c52::operator()(&local_100,&local_d8,(string *)local_140,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/F3","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"r2.Y.F3","");
  test_60::anon_class_8_1_ba1d6c52::operator()(&local_100,&local_f8,(string *)local_140,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/F4","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"r2.Y.F4","");
  test_60::anon_class_8_1_ba1d6c52::operator()(&local_100,&local_f8,(string *)local_140,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"/F5","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"direct r2.Y.F5","");
  QPDFObjectHandle::newString(local_b0);
  QPDFObjectHandle::replaceKey((string *)&local_f8,(QPDFObjectHandle *)local_140);
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_140._0_8_ != (element_type *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_130._M_allocated_capacity + 1);
  }
  local_130._8_8_ = local_140 + 8;
  local_140._8_4_ = _S_red;
  local_130._M_allocated_capacity = 0;
  local_118 = 0;
  local_58 = local_110;
  local_50 = local_108;
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_108->_M_use_count = local_108->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_108->_M_use_count = local_108->_M_use_count + 1;
    }
  }
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_58;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_120 = (_Base_ptr)local_130._8_8_;
  local_b8.conflicts =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        *)local_140;
  QPDFObjectHandle::mergeResources(QVar5,(map *)local_140);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"first merge","");
  test_60::anon_class_8_1_e5d0d581::operator()(&local_b8,(string *)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  QPDFObjectHandle::shallowCopy();
  local_68 = local_110;
  local_60 = local_108;
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_108->_M_use_count = local_108->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_108->_M_use_count = local_108->_M_use_count + 1;
    }
  }
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_68;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  QPDFObjectHandle::mergeResources(QVar6,(map *)local_140);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"second merge","");
  test_60::anon_class_8_1_e5d0d581::operator()(&local_b8,(string *)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  QPDFObjectHandle::makeResourcesIndirect((QPDF *)&local_110);
  local_78 = local_110;
  local_70 = local_108;
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_108->_M_use_count = local_108->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_108->_M_use_count = local_108->_M_use_count + 1;
    }
  }
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_78;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  QPDFObjectHandle::mergeResources(QVar7,(map *)local_140);
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"third merge","");
  test_60::anon_class_8_1_e5d0d581::operator()(&local_b8,(string *)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_88 = local_110;
  local_80 = local_108;
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_108->_M_use_count = local_108->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_108->_M_use_count = local_108->_M_use_count + 1;
    }
  }
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_88;
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  QPDFObjectHandle::mergeResources(QVar8,(map *)local_140);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"fourth merge","");
  test_60::anon_class_8_1_e5d0d581::operator()(&local_b8,(string *)local_168._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  QPDF::getTrailer();
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"/QTest1","");
  QPDFObjectHandle::replaceKey(local_98,(QPDFObjectHandle *)&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"/QTest2","");
  QPDFObjectHandle::replaceKey(local_98,(QPDFObjectHandle *)&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"/QTest3","");
  QPDFObjectHandle::replaceKey(local_98,(QPDFObjectHandle *)&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  QPDFWriter::QPDFWriter((QPDFWriter *)&local_168,pQVar2,"a.pdf");
  QPDFWriter::setQDFMode(SUB81(&local_168,0));
  QPDFWriter::setStaticID(SUB81(&local_168,0));
  QPDFWriter::write();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               *)local_140);
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  if (local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
  }
  return;
}

Assistant:

static void
test_60(QPDF& pdf, char const* arg2)
{
    // Boundary condition testing for getUniqueResourceName;
    // additional testing of mergeResources with conflict
    // detection
    QPDFObjectHandle r1 = QPDFObjectHandle::newDictionary();
    int min_suffix = 1;
    for (int i = 1; i < 3; ++i) {
        std::string name = r1.getUniqueResourceName("/Quack", min_suffix);
        r1.mergeResources(QPDFObjectHandle::parse("<< /Z << >> >>"));
        r1.getKey("/Z").replaceKey(name, QPDFObjectHandle::newString("moo"));
    }
    auto make_resource =
        [&](QPDFObjectHandle& dict, std::string const& key, std::string const& str) {
            auto o1 = QPDFObjectHandle::newArray();
            o1.appendItem(QPDFObjectHandle::newString(str));
            dict.replaceKey(key, pdf.makeIndirectObject(o1));
        };

    auto z = r1.getKey("/Z");
    r1.replaceKey("/Y", QPDFObjectHandle::newDictionary());
    auto y = r1.getKey("/Y");
    make_resource(z, "/F1", "r1.Z.F1");
    make_resource(z, "/F2", "r1.Z.F2");
    make_resource(y, "/F2", "r1.Y.F2");
    make_resource(y, "/F3", "r1.Y.F3");
    QPDFObjectHandle r2 = QPDFObjectHandle::parse("<< /Z << >> /Y << >> >>");
    z = r2.getKey("/Z");
    y = r2.getKey("/Y");
    make_resource(z, "/F2", "r2.Z.F2");
    make_resource(y, "/F3", "r2.Y.F3");
    make_resource(y, "/F4", "r2.Y.F4");
    // Add a direct object
    y.replaceKey("/F5", QPDFObjectHandle::newString("direct r2.Y.F5"));

    std::map<std::string, std::map<std::string, std::string>> conflicts;
    auto show_conflicts = [&](std::string const& msg) {
        std::cout << msg << std::endl;
        for (auto const& i1: conflicts) {
            std::cout << i1.first << ":" << std::endl;
            for (auto const& i2: i1.second) {
                std::cout << "  " << i2.first << " -> " << i2.second << std::endl;
            }
        }
    };

    r1.mergeResources(r2, &conflicts);
    show_conflicts("first merge");
    auto r3 = r1.shallowCopy();
    // Merge again. The direct object gets recopied. Everything
    // else is the same.
    r1.mergeResources(r2, &conflicts);
    show_conflicts("second merge");

    // Make all resources in r2 direct. Then merge two more times.
    // We should get the one previously direct object copied one
    // time as an indirect object.
    r2.makeResourcesIndirect(pdf);
    r1.mergeResources(r2, &conflicts);
    show_conflicts("third merge");
    r1.mergeResources(r2, &conflicts);
    show_conflicts("fourth merge");

    // The only differences between /QTest and /QTest3 should be
    // the direct objects merged from r2.
    auto trailer = pdf.getTrailer();
    trailer.replaceKey("/QTest1", r1);
    trailer.replaceKey("/QTest2", r2);
    trailer.replaceKey("/QTest3", r3);
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}